

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool __thiscall kj::StringPtr::operator<(StringPtr *this,StringPtr *other)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s1;
  char *__s2;
  bool local_4a;
  bool local_49;
  size_t local_48;
  int cmp;
  bool shorter;
  StringPtr *other_local;
  StringPtr *this_local;
  
  sVar2 = ArrayPtr<const_char>::size(&this->content);
  sVar3 = ArrayPtr<const_char>::size(&other->content);
  __s1 = ArrayPtr<const_char>::begin(&this->content);
  __s2 = ArrayPtr<const_char>::begin(&other->content);
  if (sVar2 < sVar3) {
    local_48 = ArrayPtr<const_char>::size(&this->content);
  }
  else {
    local_48 = ArrayPtr<const_char>::size(&other->content);
  }
  iVar1 = memcmp(__s1,__s2,local_48);
  local_49 = true;
  if (-1 < iVar1) {
    local_4a = iVar1 == 0 && sVar2 < sVar3;
    local_49 = local_4a;
  }
  return local_49;
}

Assistant:

inline bool StringPtr::operator<(const StringPtr& other) const {
  bool shorter = content.size() < other.content.size();
  int cmp = memcmp(content.begin(), other.content.begin(),
                   shorter ? content.size() : other.content.size());
  return cmp < 0 || (cmp == 0 && shorter);
}